

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcEquipmentElement::IfcEquipmentElement(IfcEquipmentElement *this)

{
  *(undefined ***)&(this->super_IfcElement).field_0x148 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcEquipmentElement";
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__00787320);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x787218;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0x787308;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x787240;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x787268;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x787290;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x7872b8;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x7872e0;
  return;
}

Assistant:

IfcEquipmentElement() : Object("IfcEquipmentElement") {}